

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

_Bool player_get_recall_depth(player *p)

{
  bool bVar1;
  wchar_t wVar2;
  ulong uVar3;
  
  if ((0 < p->max_depth) && ((p->opts).opt[0x20] == false)) {
    bVar1 = false;
    do {
      wVar2 = get_quantity("Which level do you wish to return to (0 to cancel)? ",(int)p->max_depth)
      ;
      if (wVar2 != L'\0') {
        if ((ulong)chunk_list_max != 0) {
          uVar3 = 0;
          do {
            if (chunk_list[uVar3]->depth == wVar2) {
              bVar1 = true;
              break;
            }
            uVar3 = uVar3 + 1;
          } while (chunk_list_max != uVar3);
        }
        if (!bVar1) {
          msg("You must choose a level you have previously visited.");
        }
      }
      if (wVar2 == L'\0') {
        return false;
      }
    } while (!bVar1);
    p->recall_depth = (int16_t)wVar2;
  }
  return true;
}

Assistant:

bool player_get_recall_depth(struct player *p)
{
	bool level_ok = false;
	int new = 0;

	/*
	 * No choice when have not entered the dungeon or descent is forced,
	 * so do not prompt.
	 */
	if (p->max_depth <= 0 || OPT(p, birth_force_descend)) {
		return true;
	}
	while (!level_ok) {
		const char *prompt =
			"Which level do you wish to return to (0 to cancel)? ";
		int i;

		/* Choose the level */
		new = get_quantity(prompt, p->max_depth);
		if (new == 0) {
			return false;
		}

		/* Is that level valid? */
		for (i = 0; i < chunk_list_max; i++) {
			if (chunk_list[i]->depth == new) {
				level_ok = true;
				break;
			}
		}
		if (!level_ok) {
			msg("You must choose a level you have previously visited.");
		}
	}
	p->recall_depth = new;
	return true;
}